

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O2

int lys_check_id(lys_node *node,lys_node *parent,lys_module *module)

{
  uint uVar1;
  LYS_NODE LVar2;
  lys_node *plVar3;
  LYS_NODE LVar4;
  lys_node **pplVar5;
  lys_node_grp *plVar6;
  lys_node *plVar7;
  lys_node *plVar8;
  lys_node *plVar9;
  char *pcVar10;
  lys_node *plVar11;
  lys_node *node_00;
  ly_ctx *ctx;
  char *name;
  lys_node *plVar12;
  bool bVar13;
  
  if (node == (lys_node *)0x0) {
    __assert_fail("node",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_schema.c"
                  ,0x24c,
                  "int lys_check_id(struct lys_node *, struct lys_node *, struct lys_module *)");
  }
  if (parent == (lys_node *)0x0) {
    if (module == (lys_module *)0x0) {
      __assert_fail("module",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_schema.c"
                    ,0x24f,
                    "int lys_check_id(struct lys_node *, struct lys_node *, struct lys_module *)");
    }
LAB_0015698f:
    if ((module->field_0x40 & 1) != 0) {
      module = (lys_module *)module->data;
    }
  }
  else {
    module = parent->module;
    if (module != (lys_module *)0x0) goto LAB_0015698f;
    module = (lys_module *)0x0;
  }
  LVar4 = node->nodetype;
  uVar1 = LVar4 - LYS_CONTAINER;
  if (uVar1 < 0x40) {
    if ((0x808bUL >> ((ulong)uVar1 & 0x3f) & 1) != 0) goto LAB_001569b6;
    if ((ulong)uVar1 == 0x3f) {
      if (parent == (lys_node *)0x0) {
        pplVar5 = &module->data;
      }
      else {
        pplVar5 = lys_child(parent,LYS_CASE);
      }
      while( true ) {
        plVar12 = *pplVar5;
        if (plVar12 == (lys_node *)0x0) {
          return 0;
        }
        if ((((plVar12->nodetype & 0x807d) != LYS_UNKNOWN) && (plVar12->module == node->module)) &&
           (name = node->name, plVar12->name == name)) break;
        pplVar5 = &plVar12->next;
      }
      ctx = module->ctx;
      pcVar10 = "case";
      goto LAB_00156c17;
    }
  }
  if (LVar4 == LYS_ANYDATA) {
LAB_001569b6:
    if (parent == (lys_node *)0x0) {
LAB_001569ee:
      pplVar5 = &module->data;
      plVar12 = (lys_node *)0x0;
    }
    else {
      do {
        while( true ) {
          plVar12 = parent;
          if (plVar12 == (lys_node *)0x0) goto LAB_001569ee;
          LVar2 = plVar12->nodetype;
          if ((LVar2 & (LYS_AUGMENT|LYS_USES|LYS_CASE|LYS_CHOICE)) == LYS_UNKNOWN) {
            if (LVar2 == LYS_EXT) {
              pplVar5 = lys_child(plVar12,LVar4);
              if (pplVar5 == (lys_node **)0x0) {
                plVar9 = (lys_node *)0x0;
                goto LAB_00156c27;
              }
              goto LAB_00156c24;
            }
            goto LAB_00156a7e;
          }
          if (LVar2 == LYS_AUGMENT) break;
          parent = plVar12->parent;
        }
        parent = plVar12->prev;
      } while (plVar12->prev != (lys_node *)0x0);
LAB_00156a7e:
      pplVar5 = &plVar12->child;
    }
LAB_00156c24:
    do {
      plVar9 = *pplVar5;
LAB_00156c27:
      if (plVar9 == (lys_node *)0x0) {
        return 0;
      }
      LVar4 = plVar9->nodetype;
      if ((LVar4 & (LYS_USES|LYS_CASE)) != LYS_UNKNOWN) {
LAB_00156c54:
        pplVar5 = &plVar9->child;
        goto LAB_00156c24;
      }
      if ((((LVar4 & (LYS_ANYDATA|LYS_LIST|LYS_LEAFLIST|LYS_LEAF|LYS_CHOICE|LYS_CONTAINER)) !=
            LYS_UNKNOWN) && (plVar9->module == node->module)) && (plVar9->name == node->name)) {
        ctx = module->ctx;
        pcVar10 = strnodetype(node->nodetype);
        name = node->name;
        goto LAB_00156c17;
      }
      if (LVar4 == LYS_CHOICE) goto LAB_00156c54;
      if (plVar9->next == (lys_node *)0x0) {
        do {
          if (plVar9->parent == plVar12) {
            return 0;
          }
          plVar9 = lys_parent(plVar9);
        } while (((plVar9 != (lys_node *)0x0) && (plVar9 != plVar12)) &&
                (plVar9->next == (lys_node *)0x0));
        if (plVar9 == plVar12) {
          return 0;
        }
      }
      pplVar5 = &plVar9->next;
    } while( true );
  }
  if (LVar4 != LYS_GROUPING) {
    return 0;
  }
  if (parent == (lys_node *)0x0) {
    plVar12 = module->data;
    bVar13 = true;
  }
  else {
    pplVar5 = lys_child(parent,LYS_GROUPING);
    bVar13 = *pplVar5 != (lys_node *)0x0;
    plVar12 = *pplVar5;
    if (!bVar13) {
      plVar12 = parent;
    }
    if (parent->nodetype == LYS_EXT) goto LAB_00156ac1;
  }
  name = node->name;
  plVar6 = lys_find_grouping_up(name,plVar12);
  if (plVar6 != (lys_node_grp *)0x0) {
    ctx = module->ctx;
    pcVar10 = "grouping";
LAB_00156c17:
    ly_vlog(ctx,LYE_DUPID,LY_VLOG_LYS,node,pcVar10,name);
    return 1;
  }
LAB_00156ac1:
  if (bVar13) {
    plVar7 = (lys_node *)0x0;
    for (plVar9 = plVar12; plVar9 != (lys_node *)0x0; plVar9 = plVar9->prev) {
      plVar11 = plVar12;
      if ((plVar7 != (lys_node *)0x0) && (plVar11 = plVar7, plVar9 == plVar7)) {
        return 0;
      }
      plVar7 = plVar11;
      if ((plVar9->nodetype & (LYS_GROUPING|LYS_OUTPUT|LYS_INPUT|LYS_LIST|LYS_CHOICE|LYS_CONTAINER))
          != LYS_UNKNOWN) {
        plVar11 = (lys_node *)0x0;
        do {
          if (plVar11 == (lys_node *)0x0) {
            plVar11 = plVar9;
          }
          LVar4 = plVar11->nodetype;
          node_00 = plVar11;
          do {
            plVar8 = node_00;
            plVar3 = node_00;
            if (((LVar4 & (LYS_GROUPING|LYS_OUTPUT|LYS_INPUT|LYS_LIST|LYS_CHOICE|LYS_CONTAINER)) !=
                 LYS_UNKNOWN) && (plVar11 = node_00->child, plVar11 != (lys_node *)0x0))
            goto LAB_00156b30;
            while( true ) {
              node_00 = plVar8;
              if (node_00 == plVar9) goto LAB_00156b5d;
              plVar11 = plVar3->next;
LAB_00156b30:
              if (plVar11 != (lys_node *)0x0) break;
              plVar8 = lys_parent(node_00);
              plVar3 = node_00;
            }
            LVar4 = plVar11->nodetype;
            node_00 = plVar11;
          } while (LVar4 != LYS_GROUPING);
          name = node->name;
        } while (name != plVar11->name);
        ctx = module->ctx;
        pcVar10 = "grouping";
        goto LAB_00156c17;
      }
LAB_00156b5d:
    }
  }
  return 0;
}

Assistant:

int
lys_check_id(struct lys_node *node, struct lys_node *parent, struct lys_module *module)
{
    struct lys_node *start, *stop, *iter;
    struct lys_node_grp *grp;
    int down, up;

    assert(node);

    if (!parent) {
        assert(module);
    } else {
        module = parent->module;
    }
    module = lys_main_module(module);

    switch (node->nodetype) {
    case LYS_GROUPING:
        /* 6.2.1, rule 6 */
        if (parent) {
            start = *lys_child(parent, LYS_GROUPING);
            if (!start) {
                down = 0;
                start = parent;
            } else {
                down = 1;
            }
            if (parent->nodetype == LYS_EXT) {
                up = 0;
            } else {
                up = 1;
            }
        } else {
            down = up = 1;
            start = module->data;
        }
        /* go up */
        if (up && lys_find_grouping_up(node->name, start)) {
            LOGVAL(module->ctx, LYE_DUPID, LY_VLOG_LYS, node, "grouping", node->name);
            return EXIT_FAILURE;
        }
        /* go down, because grouping can be defined after e.g. container in which is collision */
        if (down) {
            for (iter = start, stop = NULL; iter; iter = iter->prev) {
                if (!stop) {
                    stop = start;
                } else if (iter == stop) {
                    break;
                }
                if (!(iter->nodetype & (LYS_CONTAINER | LYS_CHOICE | LYS_LIST | LYS_GROUPING | LYS_INPUT | LYS_OUTPUT))) {
                    continue;
                }

                grp = NULL;
                while ((grp = lys_get_next_grouping(grp, iter))) {
                    if (ly_strequal(node->name, grp->name, 1)) {
                        LOGVAL(module->ctx, LYE_DUPID,LY_VLOG_LYS, node, "grouping", node->name);
                        return EXIT_FAILURE;
                    }
                }
            }
        }
        break;
    case LYS_LEAF:
    case LYS_LEAFLIST:
    case LYS_LIST:
    case LYS_CONTAINER:
    case LYS_CHOICE:
    case LYS_ANYDATA:
        /* 6.2.1, rule 7 */
        if (parent) {
            iter = parent;
            while (iter && (iter->nodetype & (LYS_USES | LYS_CASE | LYS_CHOICE | LYS_AUGMENT))) {
                if (iter->nodetype == LYS_AUGMENT) {
                    if (((struct lys_node_augment *)iter)->target) {
                        /* augment is resolved, go up */
                        iter = ((struct lys_node_augment *)iter)->target;
                        continue;
                    }
                    /* augment is not resolved, this is the final parent */
                    break;
                }
                iter = iter->parent;
            }

            if (!iter) {
                stop = NULL;
                iter = module->data;
            } else if (iter->nodetype == LYS_EXT) {
                stop = iter;
                iter = (struct lys_node *)lys_child(iter, node->nodetype);
                if (iter) {
                    iter = *(struct lys_node **)iter;
                }
            } else {
                stop = iter;
                iter = iter->child;
            }
        } else {
            stop = NULL;
            iter = module->data;
        }
        while (iter) {
            if (iter->nodetype & (LYS_USES | LYS_CASE)) {
                iter = iter->child;
                continue;
            }

            if (iter->nodetype & (LYS_LEAF | LYS_LEAFLIST | LYS_LIST | LYS_CONTAINER | LYS_CHOICE | LYS_ANYDATA)) {
                if (iter->module == node->module && ly_strequal(iter->name, node->name, 1)) {
                    LOGVAL(module->ctx, LYE_DUPID, LY_VLOG_LYS, node, strnodetype(node->nodetype), node->name);
                    return EXIT_FAILURE;
                }
            }

            /* special case for choice - we must check the choice's name as
             * well as the names of nodes under the choice
             */
            if (iter->nodetype == LYS_CHOICE) {
                iter = iter->child;
                continue;
            }

            /* go to siblings */
            if (!iter->next) {
                /* no sibling, go to parent's sibling */
                do {
                    /* for parent LYS_AUGMENT */
                    if (iter->parent == stop) {
                        iter = stop;
                        break;
                    }
                    iter = lys_parent(iter);
                    if (iter && iter->next) {
                        break;
                    }
                } while (iter != stop);

                if (iter == stop) {
                    break;
                }
            }
            iter = iter->next;
        }
        break;
    case LYS_CASE:
        /* 6.2.1, rule 8 */
        if (parent) {
            start = *lys_child(parent, LYS_CASE);
        } else {
            start = module->data;
        }

        LY_TREE_FOR(start, iter) {
            if (!(iter->nodetype & (LYS_ANYDATA | LYS_CASE | LYS_CONTAINER | LYS_LEAF | LYS_LEAFLIST | LYS_LIST))) {
                continue;
            }

            if (iter->module == node->module && ly_strequal(iter->name, node->name, 1)) {
                LOGVAL(module->ctx, LYE_DUPID, LY_VLOG_LYS, node, "case", node->name);
                return EXIT_FAILURE;
            }
        }
        break;
    default:
        /* no check needed */
        break;
    }

    return EXIT_SUCCESS;
}